

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.h
# Opt level: O2

int hydro_x25519_canon(hydro_x25519_limb_t *x)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  hydro_x25519_limb_t over;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  over = 0x13;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    puVar1 = x + lVar2;
    uVar4 = *puVar1;
    *puVar1 = *puVar1 + over;
    over = (hydro_x25519_limb_t)CARRY8(uVar4,over);
  }
  hydro_x25519_propagate(x,over);
  lVar2 = -1;
  uVar4 = 0xffffffffffffffed;
  uVar5 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    uVar6 = uVar4 + x[lVar3];
    uVar4 = lVar2 + (ulong)CARRY8(uVar4,x[lVar3]);
    x[lVar3] = uVar6;
    uVar5 = uVar5 | uVar6;
    lVar2 = (long)uVar4 >> 0x3f;
  }
  return (uVar5 != 0) - 1;
}

Assistant:

static int
hydro_x25519_canon(hydro_x25519_fe x)
{
    hydro_x25519_sdlimb_t carry;
    hydro_x25519_limb_t   carry0 = 19;
    hydro_x25519_limb_t   res;
    int                   i;

    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        x[i] = hydro_x25519_adc0(&carry0, x[i]);
    }
    hydro_x25519_propagate(x, carry0);
    carry = -19;
    res   = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        res |= x[i] = (hydro_x25519_limb_t) (carry += x[i]);
        carry >>= hydro_x25519_WBITS;
    }
    return ((hydro_x25519_dlimb_t) res - 1) >> hydro_x25519_WBITS;
}